

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

int NCONF_load_bio(CONF *conf,BIO *in,long *out_error_line)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  char *pcVar3;
  CONF_SECTION *from;
  stack_st_CONF_VALUE *psVar4;
  bool bVar5;
  CONF_SECTION *local_b0;
  CONF_SECTION *tv;
  char *ss;
  char *pname;
  char *psection;
  char *start;
  char *buf;
  char *section;
  CONF_SECTION *sv;
  CONF_VALUE *v;
  long eline;
  char *pcStack_58;
  int again;
  char *end;
  char *p;
  char *s;
  BUF_MEM *buff;
  int local_30;
  int ii;
  int i;
  int bufnum;
  long *out_error_line_local;
  BIO *in_local;
  CONF *conf_local;
  
  ii = 0;
  s = (char *)0x0;
  v = (CONF_VALUE *)0x0;
  sv = (CONF_SECTION *)0x0;
  section = (char *)0x0;
  buf = (char *)0x0;
  _i = out_error_line;
  out_error_line_local = (long *)in;
  in_local = (BIO *)conf;
  s = (char *)BUF_MEM_new();
  if ((BUF_MEM *)s == (BUF_MEM *)0x0) {
    ERR_put_error(0xd,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,0x17f);
  }
  else {
    buf = OPENSSL_strdup("default");
    if (buf != (char *)0x0) {
      section = (char *)NCONF_new_section((CONF *)in_local,buf);
      if ((CONF_SECTION *)section == (CONF_SECTION *)0x0) {
        ERR_put_error(0xd,0,0x68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                      ,0x18a);
      }
      else {
        ii = 0;
        eline._4_4_ = 0;
        do {
          while( true ) {
            do {
              do {
                iVar1 = BUF_MEM_grow((BUF_MEM *)s,(long)ii + 0x200);
                if (CONCAT44(extraout_var,iVar1) == 0) {
                  ERR_put_error(0xd,0,7,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                                ,0x192);
                  goto LAB_002f9e21;
                }
                end = (char *)(*(long *)(s + 8) + (long)ii);
                *end = '\0';
                BIO_gets((BIO *)out_error_line_local,end,0x1ff);
                end[0x1ff] = '\0';
                sVar2 = strlen(end);
                buff._4_4_ = (int)sVar2;
                local_30 = buff._4_4_;
                if ((buff._4_4_ == 0) && (eline._4_4_ == 0)) {
                  BUF_MEM_free((BUF_MEM *)s);
                  OPENSSL_free(buf);
                  return 1;
                }
                eline._4_4_ = 0;
                while ((0 < local_30 &&
                       ((end[local_30 + -1] == '\r' || (end[local_30 + -1] == '\n'))))) {
                  local_30 = local_30 + -1;
                }
                if ((buff._4_4_ == 0) || (local_30 != buff._4_4_)) {
                  end[local_30] = '\0';
                  v = (CONF_VALUE *)((long)&v->section + 1);
                }
                else {
                  eline._4_4_ = 1;
                }
                ii = local_30 + ii;
                sv = (CONF_SECTION *)0x0;
                if (0 < ii) {
                  end = (char *)(*(long *)(s + 8) + (long)(ii + -1));
                  iVar1 = is_esc(*end);
                  if ((iVar1 != 0) && ((ii < 2 || (iVar1 = is_esc(end[-1]), iVar1 == 0)))) {
                    ii = ii + -1;
                    eline._4_4_ = 1;
                  }
                }
              } while (eline._4_4_ != 0);
              ii = 0;
              pcVar3 = *(char **)(s + 8);
              clear_comments(pcVar3);
              pcVar3 = eat_ws(pcVar3);
              p = pcVar3;
            } while (*pcVar3 == '\0');
            if (*pcVar3 == '[') break;
            pname = (char *)0x0;
            pcStack_58 = eat_name(pcVar3);
            ss = pcVar3;
            if ((*pcStack_58 == ':') && (pcStack_58[1] == ':')) {
              *pcStack_58 = '\0';
              ss = pcStack_58 + 2;
              pcStack_58 = ss;
              pcStack_58 = eat_name(ss);
              pname = pcVar3;
            }
            end = eat_ws(pcStack_58);
            if (*end != '=') {
              ERR_put_error(0xd,0,0x66,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                            ,499);
              goto LAB_002f9e21;
            }
            *pcStack_58 = '\0';
            end = end + 1;
            pcVar3 = eat_ws(end);
            for (; *end != '\0'; end = end + 1) {
            }
            do {
              end = end + -1;
              bVar5 = false;
              if (end != pcVar3) {
                iVar1 = is_conf_ws(*end);
                bVar5 = iVar1 != 0;
              }
            } while (bVar5);
            end = end + 1;
            *end = '\0';
            sv = (CONF_SECTION *)CONF_VALUE_new();
            if ((CONF_VALUE *)sv == (CONF_VALUE *)0x0) goto LAB_002f9e21;
            if (pname == (char *)0x0) {
              pname = buf;
            }
            psVar4 = (stack_st_CONF_VALUE *)OPENSSL_strdup(ss);
            sv->values = psVar4;
            if ((sv->values == (stack_st_CONF_VALUE *)0x0) ||
               (iVar1 = str_copy((CONF *)in_local,pname,&sv[1].name,pcVar3), iVar1 == 0))
            goto LAB_002f9e21;
            iVar1 = strcmp(pname,buf);
            if (iVar1 == 0) {
              local_b0 = (CONF_SECTION *)section;
            }
            else {
              local_b0 = get_section((CONF *)in_local,pname);
              if (local_b0 == (CONF_SECTION *)0x0) {
                local_b0 = NCONF_new_section((CONF *)in_local,pname);
              }
              if (local_b0 == (CONF_SECTION *)0x0) {
                ERR_put_error(0xd,0,0x68,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                              ,0x217);
                goto LAB_002f9e21;
              }
            }
            iVar1 = add_string((CONF *)in_local,local_b0,(CONF_VALUE *)sv);
            if (iVar1 == 0) goto LAB_002f9e21;
            sv = (CONF_SECTION *)0x0;
          }
          p = pcVar3 + 1;
          from = (CONF_SECTION *)eat_ws(p);
          tv = from;
          while( true ) {
            pcStack_58 = eat_name((char *)tv);
            end = eat_ws(pcStack_58);
            if (*(char *)&((CONF_SECTION *)end)->name == ']') break;
            if ((*(char *)&((CONF_SECTION *)end)->name == '\0') ||
               (bVar5 = tv == (CONF_SECTION *)end, tv = (CONF_SECTION *)end, bVar5)) {
              ERR_put_error(0xd,0,0x65,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                            ,0x1d7);
              goto LAB_002f9e21;
            }
          }
          *pcStack_58 = '\0';
          iVar1 = str_copy((CONF *)in_local,(char *)0x0,&buf,(char *)from);
          if (iVar1 == 0) goto LAB_002f9e21;
          section = (char *)get_section((CONF *)in_local,buf);
          if ((CONF_SECTION *)section == (CONF_SECTION *)0x0) {
            section = (char *)NCONF_new_section((CONF *)in_local,buf);
          }
        } while (section != (char *)0x0);
        ERR_put_error(0xd,0,0x68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                      ,0x1e2);
      }
    }
  }
LAB_002f9e21:
  BUF_MEM_free((BUF_MEM *)s);
  OPENSSL_free(buf);
  if (_i != (long *)0x0) {
    *_i = (long)v;
  }
  ERR_add_error_dataf("line %ld",v);
  value_free((CONF_VALUE *)sv);
  return 0;
}

Assistant:

int NCONF_load_bio(CONF *conf, BIO *in, long *out_error_line) {
  static const size_t CONFBUFSIZE = 512;
  int bufnum = 0, i, ii;
  BUF_MEM *buff = NULL;
  char *s, *p, *end;
  int again;
  long eline = 0;
  CONF_VALUE *v = NULL;
  CONF_SECTION *sv = NULL;
  char *section = NULL, *buf;
  char *start, *psection, *pname;

  if ((buff = BUF_MEM_new()) == NULL) {
    OPENSSL_PUT_ERROR(CONF, ERR_R_BUF_LIB);
    goto err;
  }

  section = OPENSSL_strdup(kDefaultSectionName);
  if (section == NULL) {
    goto err;
  }

  sv = NCONF_new_section(conf, section);
  if (sv == NULL) {
    OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
    goto err;
  }

  bufnum = 0;
  again = 0;
  for (;;) {
    if (!BUF_MEM_grow(buff, bufnum + CONFBUFSIZE)) {
      OPENSSL_PUT_ERROR(CONF, ERR_R_BUF_LIB);
      goto err;
    }
    p = &(buff->data[bufnum]);
    *p = '\0';
    BIO_gets(in, p, CONFBUFSIZE - 1);
    p[CONFBUFSIZE - 1] = '\0';
    ii = i = strlen(p);
    if (i == 0 && !again) {
      break;
    }
    again = 0;
    while (i > 0) {
      if ((p[i - 1] != '\r') && (p[i - 1] != '\n')) {
        break;
      } else {
        i--;
      }
    }
    // we removed some trailing stuff so there is a new
    // line on the end.
    if (ii && i == ii) {
      again = 1;  // long line
    } else {
      p[i] = '\0';
      eline++;  // another input line
    }

    // we now have a line with trailing \r\n removed

    // i is the number of bytes
    bufnum += i;

    v = NULL;
    // check for line continuation
    if (bufnum >= 1) {
      // If we have bytes and the last char '\\' and
      // second last char is not '\\'
      p = &(buff->data[bufnum - 1]);
      if (is_esc(p[0]) && ((bufnum <= 1) || !is_esc(p[-1]))) {
        bufnum--;
        again = 1;
      }
    }
    if (again) {
      continue;
    }
    bufnum = 0;
    buf = buff->data;

    clear_comments(buf);
    s = eat_ws(buf);
    if (*s == '\0') {
      continue;  // blank line
    }
    if (*s == '[') {
      char *ss;

      s++;
      start = eat_ws(s);
      ss = start;
    again:
      end = eat_name(ss);
      p = eat_ws(end);
      if (*p != ']') {
        if (*p != '\0' && ss != p) {
          ss = p;
          goto again;
        }
        OPENSSL_PUT_ERROR(CONF, CONF_R_MISSING_CLOSE_SQUARE_BRACKET);
        goto err;
      }
      *end = '\0';
      if (!str_copy(conf, NULL, &section, start)) {
        goto err;
      }
      if ((sv = get_section(conf, section)) == NULL) {
        sv = NCONF_new_section(conf, section);
      }
      if (sv == NULL) {
        OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
        goto err;
      }
      continue;
    } else {
      pname = s;
      psection = NULL;
      end = eat_name(s);
      if ((end[0] == ':') && (end[1] == ':')) {
        *end = '\0';
        end += 2;
        psection = pname;
        pname = end;
        end = eat_name(end);
      }
      p = eat_ws(end);
      if (*p != '=') {
        OPENSSL_PUT_ERROR(CONF, CONF_R_MISSING_EQUAL_SIGN);
        goto err;
      }
      *end = '\0';
      p++;
      start = eat_ws(p);
      while (*p != '\0') {
        p++;
      }
      p--;
      while (p != start && is_conf_ws(*p)) {
        p--;
      }
      p++;
      *p = '\0';

      if (!(v = CONF_VALUE_new())) {
        goto err;
      }
      if (psection == NULL) {
        psection = section;
      }
      v->name = OPENSSL_strdup(pname);
      if (v->name == NULL) {
        goto err;
      }
      if (!str_copy(conf, psection, &(v->value), start)) {
        goto err;
      }

      CONF_SECTION *tv;
      if (strcmp(psection, section) != 0) {
        if ((tv = get_section(conf, psection)) == NULL) {
          tv = NCONF_new_section(conf, psection);
        }
        if (tv == NULL) {
          OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
          goto err;
        }
      } else {
        tv = sv;
      }
      if (add_string(conf, tv, v) == 0) {
        goto err;
      }
      v = NULL;
    }
  }
  BUF_MEM_free(buff);
  OPENSSL_free(section);
  return 1;

err:
  BUF_MEM_free(buff);
  OPENSSL_free(section);
  if (out_error_line != NULL) {
    *out_error_line = eline;
  }
  ERR_add_error_dataf("line %ld", eline);
  value_free(v);
  return 0;
}